

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint,CScript,unsigned_int>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *s,COutPoint *args,CScript *args_1,
               uint *args_2)

{
  long lVar1;
  ParamsStream<AutoFile_&,_TransactionSerParams> *in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<AutoFile_&,_TransactionSerParams>,_COutPoint>
            (in_RCX,(COutPoint *)0x1124898);
  Serialize<ParamsStream<AutoFile_&,_TransactionSerParams>,_CScript>(in_RCX,(CScript *)0x11248a7);
  Serialize<ParamsStream<AutoFile&,TransactionSerParams>>(in_RCX,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}